

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  uint uVar3;
  char *pcVar4;
  uv_fs_t *puVar5;
  uv_fs_event_t *puVar6;
  uv_timer_t *loop_00;
  uv_fs_event_t *puVar7;
  uv_fs_t uStack_1f0;
  uv_loop_t *puStack_38;
  code *pcStack_30;
  char *pcStack_28;
  
  uVar3 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar3;
  fs_event_cb_called = uVar3;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_0014e00d;
    if (1 < events - 1U) goto LAB_0014e012;
    iVar1 = strncmp(filename,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar3 != 0x20) {
        return;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_0014e00d:
    fs_event_cb_dir_multi_file_cold_2();
LAB_0014e012:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_30 = (code *)0x14e09e;
  pcStack_28 = pcVar4;
  loop = uv_default_loop();
  pcStack_30 = (code *)0x14e0b0;
  remove("watch_dir/file2");
  pcStack_30 = (code *)0x14e0bf;
  remove("watch_dir/file1");
  pcStack_30 = (code *)0x14e0cb;
  remove("watch_dir/");
  pcStack_30 = (code *)0x14e0d7;
  create_dir("watch_dir");
  pcStack_30 = (code *)0x14e0df;
  create_file("watch_dir/file1");
  pcStack_30 = (code *)0x14e0e7;
  create_file("watch_dir/file2");
  pcStack_30 = (code *)0x14e0f6;
  loop_00 = (uv_timer_t *)loop;
  iVar1 = uv_fs_event_init(loop,&fs_event);
  if (iVar1 == 0) {
    puVar6 = &fs_event;
    pcStack_30 = (code *)0x14e11a;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    loop_00 = (uv_timer_t *)puVar6;
    if (iVar1 != 0) goto LAB_0014e1f0;
    pcStack_30 = (code *)0x14e131;
    loop_00 = (uv_timer_t *)loop;
    iVar1 = uv_timer_init(loop,&timer);
    if (iVar1 != 0) goto LAB_0014e1f5;
    loop_00 = &timer;
    pcStack_30 = (code *)0x14e156;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_0014e1fa;
    pcStack_30 = (code *)0x14e168;
    loop_00 = (uv_timer_t *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 1) goto LAB_0014e1ff;
    if (timer_cb_called != 2) goto LAB_0014e204;
    if (close_cb_called != 2) goto LAB_0014e209;
    pcStack_30 = (code *)0x14e197;
    remove("watch_dir/file2");
    pcStack_30 = (code *)0x14e1a3;
    remove("watch_dir/file1");
    pcStack_30 = (code *)0x14e1af;
    remove("watch_dir/");
    pcStack_30 = (code *)0x14e1b4;
    loop = uv_default_loop();
    pcStack_30 = (code *)0x14e1c8;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_30 = (code *)0x14e1d2;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_30 = (code *)0x14e1d7;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcStack_30 = (code *)0x14e1df;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x14e1f0;
    run_test_fs_event_watch_file_cold_1();
LAB_0014e1f0:
    pcStack_30 = (code *)0x14e1f5;
    run_test_fs_event_watch_file_cold_2();
LAB_0014e1f5:
    pcStack_30 = (code *)0x14e1fa;
    run_test_fs_event_watch_file_cold_3();
LAB_0014e1fa:
    pcStack_30 = (code *)0x14e1ff;
    run_test_fs_event_watch_file_cold_4();
LAB_0014e1ff:
    pcStack_30 = (code *)0x14e204;
    run_test_fs_event_watch_file_cold_5();
LAB_0014e204:
    pcStack_30 = (code *)0x14e209;
    run_test_fs_event_watch_file_cold_6();
LAB_0014e209:
    pcStack_30 = (code *)0x14e20e;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_30 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_30 = (code *)0x192f1e;
  puVar6 = (uv_fs_event_t *)&uStack_1f0;
  puVar5 = &uStack_1f0;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar2 = 0x41;
  puStack_38 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1f0,(char *)loop_00,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup(&uStack_1f0);
    puVar7 = (uv_fs_event_t *)0x0;
    iVar2 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_1f0,iVar1,(uv_fs_cb)0x0);
    puVar6 = (uv_fs_event_t *)puVar5;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&uStack_1f0);
      return;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (iVar2 != 0) goto LAB_0014e2d3;
    if (extraout_EDX != 2) goto LAB_0014e2d8;
    iVar1 = strcmp((char *)puVar6,"file2");
    if (iVar1 == 0) {
      puVar6 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_0014e2e2;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0014e2d3:
    fs_event_cb_file_cold_2();
LAB_0014e2d8:
    puVar6 = puVar7;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_0014e2e2:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close((uv_handle_t *)puVar6,close_cb);
  return;
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #else
  ASSERT(filename == NULL ||
         strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT(0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}